

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMEntityReferenceImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMEntityReferenceImpl::setReadOnly
          (DOMEntityReferenceImpl *this,bool readOnl,bool deep)

{
  DOMDocument *pDVar1;
  bool bVar2;
  int iVar3;
  DOMException *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MemoryManager *local_80;
  DOMDocumentImpl *local_70;
  long local_60;
  MemoryManager *local_50;
  DOMDocumentImpl *local_40;
  bool deep_local;
  bool readOnl_local;
  DOMEntityReferenceImpl *this_local;
  
  pDVar1 = (this->fParent).fOwnerDocument;
  if (pDVar1 == (DOMDocument *)0x0) {
    local_40 = (DOMDocumentImpl *)0x0;
  }
  else {
    local_40 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
  }
  bVar2 = DOMDocumentImpl::getErrorChecking(local_40);
  if ((bVar2) && (!readOnl)) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this == (DOMEntityReferenceImpl *)0x0) {
      local_50 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMEntityReference).super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var,iVar3) == 0) {
        local_60 = 0;
      }
      else {
        local_60 = CONCAT44(extraout_var,iVar3) + -8;
      }
      if (local_60 == 0) {
        local_80 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar3 = (*(this->super_DOMEntityReference).super_DOMNode._vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_00,iVar3) == 0) {
          local_70 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_70 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar3) + -8);
        }
        local_80 = DOMDocumentImpl::getMemoryManager(local_70);
      }
      local_50 = local_80;
    }
    DOMException::DOMException(this_00,7,0,local_50);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  DOMNodeImpl::setReadOnly(&this->fNode,readOnl,deep);
  return;
}

Assistant:

void DOMEntityReferenceImpl::setReadOnly(bool readOnl,bool deep)
{
    if(((DOMDocumentImpl *)fParent.fOwnerDocument)->getErrorChecking() && readOnl==false)
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);
    fNode.setReadOnly(readOnl,deep);
}